

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

string * __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::getGeometryShader_abi_cxx11_
          (string *__return_storage_ptr__,ViewportIndexSubroutine *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n${VIEWPORT_ARRAY_ENABLE}\n\nlayout(points, invocations = 1)          in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nflat out int gs_fs_color;\n\nsubroutine void indexSetter(void);\n\nsubroutine(indexSetter) void four()\n{\n    gs_fs_color      = 4;\n    gl_ViewportIndex = 4;\n}\n\nsubroutine(indexSetter) void five()\n{\n    gs_fs_color      = 5;\n    gl_ViewportIndex = 5;\n}\n\nsubroutine uniform indexSetter routine;\n\nvoid main()\n{\n    routine();\n    gl_Position  = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    routine();\n    gl_Position  = vec4(-1, 1, 0, 1);\n    EmitVertex();\n    routine();\n    gl_Position  = vec4(1, -1, 0, 1);\n    EmitVertex();\n    routine();\n    gl_Position  = vec4(1, 1, 0, 1);\n    EmitVertex();\n}\n\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string ViewportIndexSubroutine::getGeometryShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "${GEOMETRY_SHADER_ENABLE}\n"
								  "${VIEWPORT_ARRAY_ENABLE}\n"
								  "\n"
								  "layout(points, invocations = 1)          in;\n"
								  "layout(triangle_strip, max_vertices = 4) out;\n"
								  "\n"
								  "flat out int gs_fs_color;\n"
								  "\n"
								  "subroutine void indexSetter(void);\n"
								  "\n"
								  "subroutine(indexSetter) void four()\n"
								  "{\n"
								  "    gs_fs_color      = 4;\n"
								  "    gl_ViewportIndex = 4;\n"
								  "}\n"
								  "\n"
								  "subroutine(indexSetter) void five()\n"
								  "{\n"
								  "    gs_fs_color      = 5;\n"
								  "    gl_ViewportIndex = 5;\n"
								  "}\n"
								  "\n"
								  "subroutine uniform indexSetter routine;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    routine();\n"
								  "    gl_Position  = vec4(-1, -1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    routine();\n"
								  "    gl_Position  = vec4(-1, 1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    routine();\n"
								  "    gl_Position  = vec4(1, -1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    routine();\n"
								  "    gl_Position  = vec4(1, 1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}